

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_util.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
adjust_freqs(vector<unsigned_long,_std::allocator<unsigned_long>_> *freqs,uint32_t largest_sym,
            bool require_u16,uint32_t H_approx)

{
  bool bVar1;
  unsigned_short uVar2;
  uint uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  const_reference pvVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  allocator_type *__a;
  reference puVar10;
  byte in_CL;
  int in_EDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined4 in_R8D;
  undefined1 auVar11 [16];
  double XH;
  uint max_norm_freq;
  uint32_t u16_limit;
  double threshold;
  double approx_factor;
  vector<unsigned_int,_std::allocator<unsigned_int>_> prev;
  double H;
  size_t i_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mapping;
  size_t i_1;
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  sorted_freqs;
  size_t target_frame_size;
  size_t i;
  size_t freq_sum;
  size_t sigma;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *scaled;
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  *in_stack_fffffffffffffe68;
  unsigned_long *in_stack_fffffffffffffe70;
  __normal_iterator<std::pair<unsigned_long,_unsigned_int>_*,_std::vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>_>
  in_stack_fffffffffffffe78;
  __normal_iterator<std::pair<unsigned_long,_unsigned_int>_*,_std::vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>_>
  in_stack_fffffffffffffe80;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  size_type in_stack_fffffffffffffe88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar12;
  double freq_sum_00;
  undefined4 in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  ulong freqs_sum;
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  *S;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *Q;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *P;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_100;
  uint uVar13;
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  local_dd;
  undefined1 local_b9 [17];
  ulong local_a8;
  undefined1 local_99 [25];
  pair<unsigned_long,_unsigned_int> *local_80;
  pair<unsigned_long,_unsigned_int> *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  long local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  undefined4 local_1c;
  byte local_15;
  int local_14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_15 = in_CL & 1;
  local_28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_30 = 0;
  local_38 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  local_1c = in_R8D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  while (P = local_38,
        pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10),
        P < pvVar4) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,(size_type)local_38);
    local_30 = *pvVar5 + local_30;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,(size_type)local_38);
    local_28 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &local_28->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                       ->_M_impl).super__Vector_impl_data._M_start + (ulong)(*pvVar5 != 0));
    local_38 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_38->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  local_40 = local_28;
  bVar1 = is_power_of_two((uint64_t)local_28);
  if (!bVar1) {
    local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               next_power_of_two((uint64_t)local_40);
  }
  std::
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
            *)0x17c40e);
  local_60 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  while (Q = local_60,
        pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10),
        Q < pvVar6) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_10,(size_type)local_60);
    if (*pvVar5 != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                (local_10,(size_type)local_60);
      std::
      vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>
      ::emplace_back<unsigned_long_const&,unsigned_long&>
                ((vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
                  *)in_stack_fffffffffffffe80._M_current,
                 &(in_stack_fffffffffffffe78._M_current)->first,in_stack_fffffffffffffe70);
    }
    local_60 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  S = &local_58;
  local_78 = (pair<unsigned_long,_unsigned_int> *)
             std::
             vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
             ::begin(in_stack_fffffffffffffe68);
  local_80 = (pair<unsigned_long,_unsigned_int> *)
             std::
             vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
             ::end(in_stack_fffffffffffffe68);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_int>*,std::vector<std::pair<unsigned_long,unsigned_int>,std::allocator<std::pair<unsigned_long,unsigned_int>>>>>
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  pvVar4 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_99;
  pvVar6 = local_28;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17c527);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             (allocator_type *)in_stack_fffffffffffffe80._M_current);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17c54d);
  local_a8 = 0;
  while (freqs_sum = local_a8,
        sVar7 = std::
                vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
                ::size(&local_58), freqs_sum < sVar7) {
    pvVar8 = std::
             vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
             ::operator[](&local_58,local_a8);
    in_stack_fffffffffffffea4 = pvVar8->second;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_99 + 1),
                        local_a8);
    *pvVar9 = in_stack_fffffffffffffea4;
    local_a8 = local_a8 + 1;
  }
  auVar11._0_8_ =
       entropy<unsigned_long>
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pvVar6,freqs_sum);
  auVar11._8_8_ = 0;
  local_b9[8] = 0;
  __first._M_current = (uint *)(ulong)(local_14 + 1);
  local_b9._1_4_ = 0;
  pvVar12 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_b9;
  freq_sum_00 = auVar11._0_8_;
  local_b9._9_8_ = auVar11._0_8_;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17c652);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (pvVar12,(size_type)__first._M_current,
             (value_type *)in_stack_fffffffffffffe80._M_current,
             (allocator_type *)in_stack_fffffffffffffe78._M_current);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17c67d);
  __a = (allocator_type *)(ulong)(local_14 + 1);
  local_dd.
  super__Vector_base<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_4_ = 0;
  __last._M_current = (uint *)&local_dd;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x17c6a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (pvVar12,(size_type)__first._M_current,__last._M_current,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x17c6d6);
  auVar11 = vcvtusi2sd_avx512f(auVar11,local_1c);
  pvVar12 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            ((double)local_b9._9_8_ * (auVar11._0_8_ / 1000.0 + 1.0));
  uVar2 = std::numeric_limits<unsigned_short>::max();
  uVar3 = (uint)uVar2;
  while( true ) {
    while (bVar1 = scale_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)S,pvVar4,
                               pvVar6,freqs_sum,
                               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                               (size_t)freq_sum_00), bVar1) {
      local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_40 << 1);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe68);
    local_100 = std::
                max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                          (__first,__last);
    puVar10 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator*(&local_100);
    uVar13 = *puVar10;
    in_stack_fffffffffffffe68 =
         (vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
          *)cross_entropy<unsigned_long,unsigned_int>(P,Q);
    if (((local_15 & 1) != 0) && (uVar3 <= uVar13)) break;
    if ((double)in_stack_fffffffffffffe68 < (double)pvVar12) goto LAB_0017c903;
    local_40 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_40 * 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (pvVar12,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar3,uVar13)
              );
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (pvVar12,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar3,uVar13));
LAB_0017c903:
  local_b9[8] = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__last._M_current);
  if ((local_b9[8] & 1) == 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__last._M_current);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__last._M_current);
  std::
  vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_int>,_std::allocator<std::pair<unsigned_long,_unsigned_int>_>_>
             *)__last._M_current);
  return in_RDI;
}

Assistant:

std::vector<uint32_t> adjust_freqs(const std::vector<uint64_t>& freqs,
    uint32_t largest_sym, bool require_u16, uint32_t H_approx = 1)
{
    size_t sigma = 0;
    size_t freq_sum = 0;
    for (size_t i = 0; i < freqs.size(); i++) {
        freq_sum += freqs[i];
        sigma += (freqs[i] != 0);
    }
    size_t target_frame_size = sigma;
    if (!is_power_of_two(target_frame_size)) {
        target_frame_size = next_power_of_two(target_frame_size);
    }

    std::vector<std::pair<uint64_t, uint32_t>> sorted_freqs;
    for (size_t i = 0; i < freqs.size(); i++) {
        if ((freqs[i] != 0))
            sorted_freqs.emplace_back(freqs[i], i);
    }
    std::sort(sorted_freqs.begin(), sorted_freqs.end());
    std::vector<uint32_t> mapping(sigma);
    for (size_t i = 0; i < sorted_freqs.size(); i++)
        mapping[i] = sorted_freqs[i].second;

    auto H = entropy(freqs, freq_sum);
    std::vector<uint32_t> scaled(largest_sym + 1, 0);
    std::vector<uint32_t> prev(largest_sym + 1, 0);
    double approx_factor = 1.0 + double(H_approx) / double(1000);
    double threshold = H * approx_factor;
    uint32_t u16_limit = std::numeric_limits<uint16_t>::max();
    while (true) {
        if (scale_freqs(
                scaled, freqs, mapping, target_frame_size, sigma, freq_sum)) {
            target_frame_size *= 2;
            continue;
        }
        auto max_norm_freq = *std::max_element(scaled.begin(), scaled.end());
        auto XH = cross_entropy(freqs, scaled);

        // we want all freqs to be less than u16::max to have a compact
        // frame representation
        if (require_u16 && max_norm_freq >= u16_limit) {
            // std::cout << "abort due to u16 overflow" << std::endl;
            scaled = prev;
            break;
        }
        // std::cout << "sigma=" << sigma << " m=" << freq_sum << " M=" <<
        // target_frame_size << " H=" << H << " XH=" << XH << " max_freq= " <<
        // max_norm_freq << std::endl;
        if (XH < threshold) {
            break;
        }
        target_frame_size *= 2;
        prev = scaled;
    }

    return scaled;
}